

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

bool __thiscall input_mod::open2(input_mod *this,long pos)

{
  DUH_SIGRENDERER *pDVar1;
  DUMB_IT_SIGRENDERER *sigrenderer;
  DUH_SIGRENDERER *unaff_RBP;
  sample_t_conflict **in_stack_ffffffffffffffd8;
  int pos_00;
  DUMB_IT_SIGRENDERER *itsr;
  long pos_local;
  input_mod *this_local;
  
  pos_00 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  itsr._4_4_ = (int)((ulong)pos >> 0x20);
  if (this->start_order == 0) {
    itsr._0_4_ = (int)pos;
    pDVar1 = duh_start_sigrenderer((DUH *)this,itsr._4_4_,(int)itsr,pos_00);
    this->sr = pDVar1;
  }
  else {
    pDVar1 = dumb_it_start_at_order((DUH *)pos,pos_00,(int)in_stack_ffffffffffffffd8);
    this->sr = pDVar1;
    if ((this->sr != (DUH_SIGRENDERER *)0x0) && (pos != 0)) {
      duh_sigrenderer_generate_samples
                (unaff_RBP,(double)CONCAT17(this_local._7_1_,this_local._0_7_),(double)this,
                 itsr._4_4_,in_stack_ffffffffffffffd8);
    }
  }
  if (this->sr == (DUH_SIGRENDERER *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sigrenderer = duh_get_it_sigrenderer((DUH_SIGRENDERER *)0x42a953);
    dumb_it_set_resampling_quality((DUMB_IT_SIGRENDERER *)pos,(int)((ulong)sigrenderer >> 0x20));
    dumb_it_set_ramp_style(sigrenderer,this->volramp);
    if (((this->super_StreamSong).super_MusInfo.m_Looping & 1U) == 0) {
      dumb_it_set_loop_callback(sigrenderer,dumb_it_callback_terminate,(void *)0x0);
    }
    dumb_it_set_xm_speed_zero_callback(sigrenderer,dumb_it_callback_terminate,(void *)0x0);
    dumb_it_set_global_volume_zero_callback(sigrenderer,dumb_it_callback_terminate,(void *)0x0);
    this_local._7_1_ = true;
  }
  return (bool)this_local._7_1_;
}

Assistant:

bool input_mod::open2(long pos)
{
	if (start_order != 0)
	{
		sr = dumb_it_start_at_order(duh, 2, start_order);
		if (sr && pos) duh_sigrenderer_generate_samples(sr, 0, 1, pos, 0);
	}
	else
	{
		sr = duh_start_sigrenderer(duh, 0, 2, pos);
	}
	if (!sr)
	{
		return false;
	}

	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	dumb_it_set_resampling_quality(itsr, interp);
	dumb_it_set_ramp_style(itsr, volramp);
	if (!m_Looping)
	{
		dumb_it_set_loop_callback(itsr, &dumb_it_callback_terminate, NULL);
	}
	dumb_it_set_xm_speed_zero_callback(itsr, &dumb_it_callback_terminate, NULL);
	dumb_it_set_global_volume_zero_callback(itsr, &dumb_it_callback_terminate, NULL);
	return true;
}